

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::IRRImporter::CanRead(IRRImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"irr");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"xml");
    if (bVar1 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        tokens[0] = "irr_scene";
        bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
      }
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool IRRImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    const std::string extension = GetExtension(pFile);
    if ( extension == "irr" ) {
        return true;
    } else if (extension == "xml" || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be nullptr and it's our duty to return true here.
         */
        if (nullptr == pIOHandler ) {
            return true;
        }
        const char* tokens[] = {"irr_scene"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }

    return false;
}